

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

fnode_service_state_t fnode_service_notify_status(fnode_service_t *svc)

{
  size_t sVar1;
  char *buf;
  long in_RDI;
  fcmd_ping cmd;
  size_t time_diff;
  size_t time_now;
  undefined4 in_stack_ffffffffffffffd8;
  
  sVar1 = fnode_service_time();
  buf = (char *)(sVar1 - *(long *)(in_RDI + 0x4b8));
  if ((char *)(ulong)*(uint *)(in_RDI + 0x430) <= buf) {
    fnet_socket_sendto((fnet_socket_t)sVar1,buf,*(size_t *)(in_RDI + 4),
                       (fnet_address_t *)CONCAT44(0x474e4950,in_stack_ffffffffffffffd8));
    *(size_t *)(in_RDI + 0x4b8) = sVar1;
  }
  return FSVC_PROCESS_COMMANDS;
}

Assistant:

fnode_service_state_t fnode_service_notify_status(fnode_service_t *svc)
{
    size_t time_now = fnode_service_time();
    size_t time_diff = time_now - svc->last_cmd_time;

    if (time_diff >= svc->keepalive)
    {
        fcmd_ping cmd = {{ FCMD_CHARS(FCMD_PING) }};
        memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
        fnet_socket_sendto(svc->socket, (const char *)&cmd, sizeof cmd, &svc->server);
        svc->last_cmd_time = time_now;
    }

    return FSVC_PROCESS_COMMANDS;
}